

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtls_openssl.cpp
# Opt level: O2

void __thiscall
QTlsPrivate::TlsCryptographOpenSSL::alertMessageSent(TlsCryptographOpenSSL *this,int value)

{
  QSslSocket *pQVar1;
  char cVar2;
  AlertLevel AVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  AVar3 = anon_unknown.dwarf_12583a::tlsAlertLevel(value);
  if (AVar3 == Fatal) {
    cVar2 = QSslSocket::isEncrypted();
    if (cVar2 == '\0') {
      this->pendingFatalAlert = true;
    }
  }
  pQVar1 = this->q;
  anon_unknown.dwarf_12583a::tlsAlertDescription((QString *)&QStack_48,value);
  QSslSocket::alertSent((AlertLevel)pQVar1,AVar3,(QString *)((ulong)(uint)value & 0xff));
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TlsCryptographOpenSSL::alertMessageSent(int value)
{
    Q_ASSERT(q);
    Q_ASSERT(d);

    const auto level = tlsAlertLevel(value);
    if (level == QSsl::AlertLevel::Fatal && !q->isEncrypted()) {
        // Note, this logic is handshake-time only:
        pendingFatalAlert = true;
    }

    emit q->alertSent(level, tlsAlertType(value), tlsAlertDescription(value));

}